

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O0

bool iutest::UnitTestImpl::ValidateTestPropertyName(string *name)

{
  bool bVar1;
  char *local_58;
  char *ban [9];
  string *name_local;
  
  ban[8] = (char *)name;
  memcpy(&local_58,&DAT_0015a300,0x48);
  bVar1 = TestProperty::ValidateName<char_const*,9ul>((string *)ban[8],(char *(*) [9])&local_58);
  return bVar1;
}

Assistant:

static bool ValidateTestPropertyName(const ::std::string& name)
    {
        const char* ban[] = {
            "name", "tests", "failures", "disabled", "skip", "errors", "time", "timestamp", "random_seed"
        };
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return TestProperty::ValidateName(name, ban);
#else
        return TestProperty::ValidateName(name, ban, ban+IUTEST_PP_COUNTOF(ban));
#endif
    }